

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O1

int __thiscall libDAI::HAK::init(HAK *this,EVP_PKEY_CTX *ctx)

{
  pointer pdVar1;
  ulong *puVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long *plVar17;
  pointer pTVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM4 [16];
  
  pTVar18 = (this->_Qa).
            super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pTVar18 !=
      (this->_Qa).
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    do {
      bVar11 = VarSet::operator&&(&pTVar18->_vs,(VarSet *)ctx);
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (bVar11) {
        pdVar3 = (pTVar18->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (long)(pTVar18->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar3;
        if (lVar13 != 0) {
          lVar13 = lVar13 >> 3;
          auVar23 = vcvtusi2sd_avx512f(in_XMM4,lVar13);
          auVar23._0_8_ = 1.0 / auVar23._0_8_;
          auVar23._8_8_ = 0;
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vbroadcastsd_avx512f(auVar23);
          uVar14 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar19);
            uVar16 = vpcmpuq_avx512f(auVar22,auVar20,2);
            pdVar1 = pdVar3 + uVar14;
            bVar11 = (bool)((byte)uVar16 & 1);
            bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar16 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar16 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar16 >> 6) & 1);
            *pdVar1 = (double)((ulong)bVar11 * auVar21._0_8_ | (ulong)!bVar11 * (long)*pdVar1);
            pdVar1[1] = (double)((ulong)bVar4 * auVar21._8_8_ | (ulong)!bVar4 * (long)pdVar1[1]);
            pdVar1[2] = (double)((ulong)bVar5 * auVar21._16_8_ | (ulong)!bVar5 * (long)pdVar1[2]);
            pdVar1[3] = (double)((ulong)bVar6 * auVar21._24_8_ | (ulong)!bVar6 * (long)pdVar1[3]);
            pdVar1[4] = (double)((ulong)bVar7 * auVar21._32_8_ | (ulong)!bVar7 * (long)pdVar1[4]);
            pdVar1[5] = (double)((ulong)bVar8 * auVar21._40_8_ | (ulong)!bVar8 * (long)pdVar1[5]);
            pdVar1[6] = (double)((ulong)bVar9 * auVar21._48_8_ | (ulong)!bVar9 * (long)pdVar1[6]);
            pdVar1[7] = (double)((uVar16 >> 7) * auVar21._56_8_ |
                                (ulong)!SUB81(uVar16 >> 7,0) * (long)pdVar1[7]);
            uVar14 = uVar14 + 8;
          } while ((lVar13 + (ulong)(lVar13 == 0) + 7 & 0xfffffffffffffff8) != uVar14);
        }
      }
      pTVar18 = pTVar18 + 1;
    } while (pTVar18 !=
             (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar13 = CONCAT44(extraout_var,iVar12);
  if (*(long *)(lVar13 + 0x100) != *(long *)(lVar13 + 0xf8)) {
    uVar14 = 0;
    do {
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      bVar11 = VarSet::operator&&((VarSet *)
                                  (uVar14 * 0x28 +
                                  *(long *)(CONCAT44(extraout_var_00,iVar12) + 0xf8)),(VarSet *)ctx)
      ;
      if (bVar11) {
        pTVar18 = (this->_Qb).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                           (this);
        lVar13 = *(long *)&pTVar18[uVar14]._p._p.super__Vector_base<double,_std::allocator<double>_>
        ;
        lVar15 = (long)pTVar18[uVar14]._p._p.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - lVar13;
        auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        if (lVar15 != 0) {
          auVar23 = vcvtusi2sd_avx512f(in_XMM4,*(undefined8 *)
                                                (*(long *)(CONCAT44(extraout_var_01,iVar12) + 0xf8)
                                                 + 0x18 + uVar14 * 0x28));
          auVar24._0_8_ = 1.0 / auVar23._0_8_;
          auVar24._8_8_ = 0;
          lVar15 = lVar15 >> 3;
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vbroadcastsd_avx512f(auVar24);
          uVar16 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar19);
            uVar10 = vpcmpuq_avx512f(auVar22,auVar20,2);
            puVar2 = (ulong *)(lVar13 + uVar16 * 8);
            bVar11 = (bool)((byte)uVar10 & 1);
            bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
            *puVar2 = (ulong)bVar11 * auVar21._0_8_ | (ulong)!bVar11 * *puVar2;
            puVar2[1] = (ulong)bVar4 * auVar21._8_8_ | (ulong)!bVar4 * puVar2[1];
            puVar2[2] = (ulong)bVar5 * auVar21._16_8_ | (ulong)!bVar5 * puVar2[2];
            puVar2[3] = (ulong)bVar6 * auVar21._24_8_ | (ulong)!bVar6 * puVar2[3];
            puVar2[4] = (ulong)bVar7 * auVar21._32_8_ | (ulong)!bVar7 * puVar2[4];
            puVar2[5] = (ulong)bVar8 * auVar21._40_8_ | (ulong)!bVar8 * puVar2[5];
            puVar2[6] = (ulong)bVar9 * auVar21._48_8_ | (ulong)!bVar9 * puVar2[6];
            puVar2[7] = (uVar10 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar10 >> 7,0) * puVar2[7];
            uVar16 = uVar16 + 8;
          } while ((lVar15 + (ulong)(lVar15 == 0) + 7 & 0xfffffffffffffff8) != uVar16);
        }
        iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                           (this);
        plVar17 = *(long **)(*(long *)(CONCAT44(extraout_var_02,iVar12) + 0x158) + uVar14 * 0x18);
        iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                           (this);
        if (plVar17 !=
            *(long **)(*(long *)(CONCAT44(extraout_var_03,iVar12) + 0x158) + 8 + uVar14 * 0x18)) {
          do {
            lVar13 = *plVar17;
            iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                               (this);
            pTVar18 = (this->_muab).
                      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar13 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_04,iVar12) + 0x128) +
                                        lVar13 * 0x18) + uVar14 * 8);
            iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                               (this);
            lVar15 = *(long *)&pTVar18[lVar13]._p._p.
                               super__Vector_base<double,_std::allocator<double>_>;
            lVar13 = (long)pTVar18[lVar13]._p._p.super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar15;
            auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            if (lVar13 != 0) {
              auVar23 = vcvtusi2sd_avx512f(in_XMM4,*(undefined8 *)
                                                    (*(long *)(CONCAT44(extraout_var_05,iVar12) +
                                                              0xf8) + 0x18 + uVar14 * 0x28));
              auVar25._0_8_ = 1.0 / auVar23._0_8_;
              auVar25._8_8_ = 0;
              lVar13 = lVar13 >> 3;
              auVar20 = vpbroadcastq_avx512f();
              auVar21 = vbroadcastsd_avx512f(auVar25);
              uVar16 = 0;
              do {
                auVar22 = vpbroadcastq_avx512f();
                auVar22 = vporq_avx512f(auVar22,auVar19);
                uVar10 = vpcmpuq_avx512f(auVar22,auVar20,2);
                puVar2 = (ulong *)(lVar15 + uVar16 * 8);
                bVar11 = (bool)((byte)uVar10 & 1);
                bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
                *puVar2 = (ulong)bVar11 * auVar21._0_8_ | (ulong)!bVar11 * *puVar2;
                puVar2[1] = (ulong)bVar4 * auVar21._8_8_ | (ulong)!bVar4 * puVar2[1];
                puVar2[2] = (ulong)bVar5 * auVar21._16_8_ | (ulong)!bVar5 * puVar2[2];
                puVar2[3] = (ulong)bVar6 * auVar21._24_8_ | (ulong)!bVar6 * puVar2[3];
                puVar2[4] = (ulong)bVar7 * auVar21._32_8_ | (ulong)!bVar7 * puVar2[4];
                puVar2[5] = (ulong)bVar8 * auVar21._40_8_ | (ulong)!bVar8 * puVar2[5];
                puVar2[6] = (ulong)bVar9 * auVar21._48_8_ | (ulong)!bVar9 * puVar2[6];
                puVar2[7] = (uVar10 >> 7) * auVar21._56_8_ |
                            (ulong)!SUB81(uVar10 >> 7,0) * puVar2[7];
                uVar16 = uVar16 + 8;
              } while ((lVar13 + (ulong)(lVar13 == 0) + 7 & 0xfffffffffffffff8) != uVar16);
            }
            lVar13 = *plVar17;
            iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                               (this);
            pTVar18 = (this->_muba).
                      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar13 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_06,iVar12) + 0x128) +
                                        lVar13 * 0x18) + uVar14 * 8);
            iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                               (this);
            auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            lVar15 = *(long *)&pTVar18[lVar13]._p._p.
                               super__Vector_base<double,_std::allocator<double>_>;
            lVar13 = (long)pTVar18[lVar13]._p._p.super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar15;
            if (lVar13 != 0) {
              auVar23 = vcvtusi2sd_avx512f(in_XMM4,*(undefined8 *)
                                                    (*(long *)(CONCAT44(extraout_var_07,iVar12) +
                                                              0xf8) + 0x18 + uVar14 * 0x28));
              auVar26._0_8_ = 1.0 / auVar23._0_8_;
              auVar26._8_8_ = 0;
              lVar13 = lVar13 >> 3;
              auVar20 = vpbroadcastq_avx512f();
              auVar21 = vbroadcastsd_avx512f(auVar26);
              uVar16 = 0;
              do {
                auVar22 = vpbroadcastq_avx512f();
                auVar22 = vporq_avx512f(auVar22,auVar19);
                uVar10 = vpcmpuq_avx512f(auVar22,auVar20,2);
                puVar2 = (ulong *)(lVar15 + uVar16 * 8);
                bVar11 = (bool)((byte)uVar10 & 1);
                bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
                *puVar2 = (ulong)bVar11 * auVar21._0_8_ | (ulong)!bVar11 * *puVar2;
                puVar2[1] = (ulong)bVar4 * auVar21._8_8_ | (ulong)!bVar4 * puVar2[1];
                puVar2[2] = (ulong)bVar5 * auVar21._16_8_ | (ulong)!bVar5 * puVar2[2];
                puVar2[3] = (ulong)bVar6 * auVar21._24_8_ | (ulong)!bVar6 * puVar2[3];
                puVar2[4] = (ulong)bVar7 * auVar21._32_8_ | (ulong)!bVar7 * puVar2[4];
                puVar2[5] = (ulong)bVar8 * auVar21._40_8_ | (ulong)!bVar8 * puVar2[5];
                puVar2[6] = (ulong)bVar9 * auVar21._48_8_ | (ulong)!bVar9 * puVar2[6];
                puVar2[7] = (uVar10 >> 7) * auVar21._56_8_ |
                            (ulong)!SUB81(uVar10 >> 7,0) * puVar2[7];
                uVar16 = uVar16 + 8;
              } while ((lVar13 + (ulong)(lVar13 == 0) + 7 & 0xfffffffffffffff8) != uVar16);
            }
            plVar17 = plVar17 + 1;
            iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                               (this);
          } while (plVar17 !=
                   *(long **)(*(long *)(CONCAT44(extraout_var_08,iVar12) + 0x158) + 8 +
                             uVar14 * 0x18));
        }
      }
      uVar14 = uVar14 + 1;
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar13 = -0x3333333333333333;
    } while (uVar14 < (ulong)((*(long *)(CONCAT44(extraout_var_09,iVar12) + 0x100) -
                               *(long *)(CONCAT44(extraout_var_09,iVar12) + 0xf8) >> 3) *
                             -0x3333333333333333));
  }
  return (int)lVar13;
}

Assistant:

void HAK::init( const VarSet &ns ) {
        for( vector<Factor>::iterator alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
            if( alpha->vars() && ns )
                alpha->fill( 1.0 / alpha->stateSpace() );

        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            if( grm().IR(beta) && ns ) {
                _Qb[beta].fill( 1.0 / grm().IR(beta).stateSpace() );
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muab(*alpha,beta).fill( 1.0 / grm().IR(beta).stateSpace() );
                    muba(beta,*alpha).fill( 1.0 / grm().IR(beta).stateSpace() );
                }
            }
    }